

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O3

void Sfm_NtkPrint(Sfm_Ntk_t *p)

{
  Vec_Int_t *pVVar1;
  ulong uVar2;
  long lVar3;
  
  if (0 < p->nObjs) {
    uVar2 = 0;
    do {
      if ((long)(p->vFanins).nSize <= (long)uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar1 = (p->vFanins).pArray;
      printf("Obj %3d : ",uVar2 & 0xffffffff);
      if ((long)p->vFixed->nSize <= (long)uVar2) {
LAB_00524990:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      printf("Fixed %d  ",(ulong)(uint)(int)p->vFixed->pArray[uVar2]);
      if ((long)p->vEmpty->nSize <= (long)uVar2) goto LAB_00524990;
      printf("Empty %d  ",(ulong)(uint)(int)p->vEmpty->pArray[uVar2]);
      printf("Truth  ");
      if ((long)p->vTruths->nSize <= (long)uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      Extra_PrintHex(_stdout,(uint *)(p->vTruths->pArray + uVar2),pVVar1[uVar2].nSize);
      printf("  ");
      printf("Vector has %d entries: {",(ulong)(uint)pVVar1[uVar2].nSize);
      if (0 < pVVar1[uVar2].nSize) {
        lVar3 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar1[uVar2].pArray[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar1[uVar2].nSize);
      }
      puts(" }");
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)p->nObjs);
  }
  return;
}

Assistant:

void Sfm_NtkPrint( Sfm_Ntk_t * p )
{
    int i;
    for ( i = 0; i < p->nObjs; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry( &p->vFanins, i );
        printf( "Obj %3d : ", i );
        printf( "Fixed %d  ", Vec_StrEntry(p->vFixed, i) );
        printf( "Empty %d  ", Vec_StrEntry(p->vEmpty, i) );
        printf( "Truth  " );
        Extra_PrintHex( stdout, (unsigned *)Vec_WrdEntryP(p->vTruths, i), Vec_IntSize(vArray) );
        printf( "  " );
        Vec_IntPrint( vArray );
    }
}